

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall Ptex::v2_4::PtexReader::~PtexReader(PtexReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Level *this_00;
  pointer pcVar2;
  pointer pFVar3;
  pointer pMVar4;
  pointer plVar5;
  pointer pLVar6;
  pointer puVar7;
  pointer pFVar8;
  pointer pcVar9;
  pointer ppLVar10;
  pointer ppLVar11;
  
  (this->super_PtexTexture)._vptr_PtexTexture = (_func_int **)&PTR__PtexReader_001246c8;
  closeFP(this);
  if (this->_constdata != (uint8_t *)0x0) {
    operator_delete__(this->_constdata);
  }
  if (this->_metadata != (MetaData *)0x0) {
    (*(this->_metadata->super_PtexMetaData)._vptr_PtexMetaData[1])();
  }
  ppLVar10 = (this->_levels).
             super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar11 = (this->_levels).
                  super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppLVar11 != ppLVar10;
      ppLVar11 = ppLVar11 + 1) {
    this_00 = *ppLVar11;
    if (this_00 != (Level *)0x0) {
      Level::~Level(this_00);
      operator_delete(this_00,0x48);
      ppLVar10 = (this->_levels).
                 super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  pcVar2 = (this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::
  ~PtexHashMap(&this->_reductions);
  pFVar3 = (this->_faceedits).
           super__Vector_base<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar3 != (pointer)0x0) {
    operator_delete(pFVar3,(long)(this->_faceedits).
                                 super__Vector_base<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar3);
  }
  pMVar4 = (this->_metaedits).
           super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar4 != (pointer)0x0) {
    operator_delete(pMVar4,(long)(this->_metaedits).
                                 super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar4);
  }
  ppLVar11 = (this->_levels).
             super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppLVar11 != (pointer)0x0) {
    operator_delete(ppLVar11,(long)(this->_levels).
                                   super__Vector_base<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppLVar11);
  }
  plVar5 = (this->_levelpos).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar5 != (pointer)0x0) {
    operator_delete(plVar5,(long)(this->_levelpos).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar5);
  }
  pLVar6 = (this->_levelinfo).
           super__Vector_base<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pLVar6 != (pointer)0x0) {
    operator_delete(pLVar6,(long)(this->_levelinfo).
                                 super__Vector_base<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar6);
  }
  puVar7 = (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)(this->_rfaceids).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  pFVar8 = (this->_faceinfo).
           super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar8 != (pointer)0x0) {
    operator_delete(pFVar8,(long)(this->_faceinfo).
                                 super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar8);
  }
  pcVar9 = (this->_path)._M_dataplus._M_p;
  paVar1 = &(this->_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar9 != paVar1) {
    operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
  }
  pthread_mutex_destroy((pthread_mutex_t *)&this->readlock);
  return;
}

Assistant:

PtexReader::~PtexReader()
{
    closeFP();
    if (_constdata) delete [] _constdata;
    if (_metadata) delete _metadata;

    for (std::vector<Level*>::iterator i = _levels.begin(); i != _levels.end(); ++i) {
        if (*i) delete *i;
    }
}